

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O3

int dsdKernelFindCommonComponents
              (Dsd_Manager_t *pDsdMan,Dsd_Node_t *pL,Dsd_Node_t *pH,Dsd_Node_t ***pCommon,
              Dsd_Node_t **pLastDiffL,Dsd_Node_t **pLastDiffH)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  Dsd_Node_t *pDVar5;
  Dsd_Node_t *pDVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int local_44;
  
  sVar1 = pL->nDecs;
  sVar2 = pH->nDecs;
  if (sVar1 < 1) {
    local_44 = 0;
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    iVar10 = 0;
    local_44 = 0;
    do {
      pDVar5 = pL->pDecs[iVar10];
      if (sVar2 <= iVar9) {
        *pLastDiffL = pDVar5;
        break;
      }
      pDVar6 = pH->pDecs[iVar9];
      piVar7 = pDsdMan->dd->perm;
      uVar3 = **(uint **)(((ulong)pDVar5 & 0xfffffffffffffffe) + 0x10);
      uVar4 = **(uint **)(((ulong)pDVar6 & 0xfffffffffffffffe) + 0x10);
      if ((piVar7[uVar3] < piVar7[uVar4]) || (uVar4 == uVar3)) {
        if (uVar3 == uVar4) {
          if (pDVar5 == pDVar6) {
            lVar8 = (long)local_44;
            local_44 = local_44 + 1;
            dsdKernelFindCommonComponents::Common[lVar8] = pDVar5;
          }
          else {
            *pLastDiffL = pDVar5;
            *pLastDiffH = pH->pDecs[iVar9];
          }
          iVar10 = iVar10 + 1;
          iVar9 = iVar9 + 1;
        }
        else {
          iVar10 = iVar10 + 1;
          *pLastDiffL = pDVar5;
        }
      }
      else {
        iVar9 = iVar9 + 1;
        *pLastDiffH = pDVar6;
      }
    } while (iVar10 < sVar1);
  }
  if (iVar9 < sVar2) {
    *pLastDiffH = pH->pDecs[iVar9];
  }
  *pCommon = dsdKernelFindCommonComponents::Common;
  return local_44;
}

Assistant:

int dsdKernelFindCommonComponents( Dsd_Manager_t * pDsdMan, Dsd_Node_t * pL, Dsd_Node_t * pH, Dsd_Node_t *** pCommon, Dsd_Node_t ** pLastDiffL, Dsd_Node_t ** pLastDiffH )
{
    static Dsd_Node_t * Common[MAXINPUTS];
    int nCommon = 0;

    // pointers to the current decomposition entries
    Dsd_Node_t * pLcur;
    Dsd_Node_t * pHcur;

    // the pointers to their supports
    DdNode * bSLcur;
    DdNode * bSHcur;

    // the top variable in the supports
    int TopVar;

    // the indices running through the components
    int iCurL = 0;
    int iCurH = 0;
    while ( iCurL < pL->nDecs && iCurH < pH->nDecs )
    { // both did not run out

        pLcur = Dsd_Regular(pL->pDecs[iCurL]);
        pHcur = Dsd_Regular(pH->pDecs[iCurH]);

        bSLcur = pLcur->S;
        bSHcur = pHcur->S;

        // find out what component is higher in the BDD
        if ( pDsdMan->dd->perm[bSLcur->index] < pDsdMan->dd->perm[bSHcur->index] )
            TopVar = bSLcur->index;
        else
            TopVar = bSHcur->index;

        if ( TopVar == bSLcur->index && TopVar == bSHcur->index ) 
        {
            // the components may be equal - should match exactly!
            if ( pL->pDecs[iCurL] == pH->pDecs[iCurH] )
                Common[nCommon++] = pL->pDecs[iCurL];
            else
            {
                *pLastDiffL = pL->pDecs[iCurL];
                *pLastDiffH = pH->pDecs[iCurH];
            }

            // skip both
            iCurL++;
            iCurH++;
        }
        else if ( TopVar == bSLcur->index )
        {  // the components cannot be equal
            // skip the top-most one
            *pLastDiffL = pL->pDecs[iCurL++];
        }
        else // if ( TopVar == bSHcur->index )
        {  // the components cannot be equal
            // skip the top-most one
            *pLastDiffH = pH->pDecs[iCurH++];
        }
    }

    // if one of the lists still has components, write the first one down
    if ( iCurL < pL->nDecs )
        *pLastDiffL = pL->pDecs[iCurL];

    if ( iCurH < pH->nDecs )
        *pLastDiffH = pH->pDecs[iCurH];

    // return the pointer to the array
    *pCommon = Common;
    // return the number of common components
    return nCommon;         
}